

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

bool __thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::parse
          (CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ostream *output,ostream *error)

{
  string local_30;
  
  Parser::parse(&local_30,&(this->super_CmdBase).arguments,&this->value);
  std::__cxx11::string::operator=((string *)&this->value,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return true;
}

Assistant:

virtual bool parse(std::ostream& output, std::ostream& error) {
				try {
					value = Parser::parse(arguments, value);
					return true;
				} catch (...) {
					return false;
				}
			}